

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_wfi_arm(CPUARMState *env,uint32_t insn_len)

{
  _Bool _Var1;
  uint32_t target_el_00;
  uint32_t syndrome;
  CPUState *cpu;
  int target_el;
  CPUState *cs;
  uint32_t insn_len_local;
  CPUARMState *env_local;
  
  cpu = env_cpu(env);
  target_el_00 = check_wfx_trap(env,false);
  _Var1 = cpu_has_work(cpu);
  if (_Var1) {
    return;
  }
  if (target_el_00 != 0) {
    if (env->aarch64 == 0) {
      env->regs[0xf] = env->regs[0xf] - insn_len;
    }
    else {
      env->pc = env->pc - (ulong)insn_len;
    }
    syndrome = syn_wfx(1,0xe,0,insn_len == 2);
    raise_exception_arm(env,1,syndrome,target_el_00);
  }
  cpu->exception_index = 0x10001;
  cpu->halted = 1;
  cpu_loop_exit_arm(cpu);
}

Assistant:

void HELPER(wfi)(CPUARMState *env, uint32_t insn_len)
{
    CPUState *cs = env_cpu(env);
    int target_el = check_wfx_trap(env, false);

    if (cpu_has_work(cs)) {
        /* Don't bother to go into our "low power state" if
         * we would just wake up immediately.
         */
        return;
    }

    if (target_el) {
        if (env->aarch64) {
            env->pc -= insn_len;
        } else {
            env->regs[15] -= insn_len;
        }

        raise_exception(env, EXCP_UDEF, syn_wfx(1, 0xe, 0, insn_len == 2),
                        target_el);
    }

    cs->exception_index = EXCP_HLT;
    cs->halted = 1;
    cpu_loop_exit(cs);
}